

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool cJSON_AddItemReferenceToArray(cJSON *array,cJSON *item)

{
  byte *pbVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  cJSON *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 uVar10;
  cJSON *pcVar11;
  cJSON_bool cVar12;
  
  if (array != (cJSON *)0x0) {
    cVar12 = 0;
    if ((item == (cJSON *)0x0) ||
       (pcVar11 = (cJSON *)(*global_hooks.allocate)(0x40), pcVar11 == (cJSON *)0x0)) {
      pcVar11 = (cJSON *)0x0;
    }
    else {
      pcVar11->valuedouble = 0.0;
      pcVar11->string = (char *)0x0;
      pcVar11->valuestring = (char *)0x0;
      *(undefined8 *)&pcVar11->valueint = 0;
      pcVar11->child = (cJSON *)0x0;
      *(undefined8 *)&pcVar11->type = 0;
      pcVar11->next = (cJSON *)0x0;
      pcVar11->prev = (cJSON *)0x0;
      pcVar2 = item->next;
      pcVar3 = item->prev;
      pcVar4 = item->child;
      iVar7 = item->type;
      uVar8 = *(undefined4 *)&item->field_0x1c;
      pcVar5 = item->valuestring;
      iVar9 = item->valueint;
      uVar10 = *(undefined4 *)&item->field_0x2c;
      pcVar6 = item->string;
      pcVar11->valuedouble = item->valuedouble;
      pcVar11->string = pcVar6;
      pcVar11->child = pcVar4;
      pcVar11->type = iVar7;
      *(undefined4 *)&pcVar11->field_0x1c = uVar8;
      pcVar11->next = pcVar2;
      pcVar11->prev = pcVar3;
      pcVar11->valuestring = pcVar5;
      pcVar11->valueint = iVar9;
      *(undefined4 *)&pcVar11->field_0x2c = uVar10;
      pcVar11->string = (char *)0x0;
      pbVar1 = (byte *)((long)&pcVar11->type + 1);
      *pbVar1 = *pbVar1 | 1;
      pcVar11->next = (cJSON *)0x0;
      pcVar11->prev = (cJSON *)0x0;
    }
    if (pcVar11 != array && pcVar11 != (cJSON *)0x0) {
      pcVar2 = array->child;
      if (pcVar2 == (cJSON *)0x0) {
        array->child = pcVar11;
        pcVar11->prev = pcVar11;
        pcVar11->next = (cJSON *)0x0;
        cVar12 = 1;
      }
      else {
        pcVar3 = pcVar2->prev;
        cVar12 = 1;
        if (pcVar3 != (cJSON *)0x0) {
          pcVar3->next = pcVar11;
          pcVar11->prev = pcVar3;
          pcVar2->prev = pcVar11;
        }
      }
    }
    return cVar12;
  }
  return 0;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_AddItemReferenceToArray(cJSON *array, cJSON *item)
{
    if (array == NULL)
    {
        return false;
    }

    return add_item_to_array(array, create_reference(item, &global_hooks));
}